

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

bool absl::lts_20250127::ParseTime
               (string_view format,string_view input,TimeZone tz,Time *time,string *err)

{
  size_t sVar1;
  string_view text;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  string_view *sv;
  string_view prefix;
  string error;
  cctz_parts parts;
  allocator<char> local_e2;
  allocator<char> local_e1;
  Time *local_e0;
  string local_d8;
  HiRep local_b0;
  femtoseconds local_a8;
  time_zone local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  time_zone local_78;
  string local_70;
  string local_50;
  
  local_88._M_str = format._M_str;
  local_88._M_len = format._M_len;
  local_98._M_str = input._M_str;
  local_98._M_len = input._M_len;
  local_e0 = time;
  local_a0 = tz.cz_.impl_;
  ParseTime::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&local_98,(string_view *)local_88._M_str);
  pcVar2 = local_98._M_str;
  text._M_str = local_98._M_str;
  text._M_len = local_98._M_len;
  lVar4 = 0;
  do {
    if (lVar4 == 0x40) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      local_b0.lo_ = 0;
      local_b0.hi_ = 0;
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_50,&local_88,&local_e1);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_70,&local_98,&local_e2);
      local_78.impl_ = local_a0.impl_;
      bVar3 = time_internal::cctz::detail::parse
                        (&local_50,&local_70,&local_78,(time_point<seconds> *)&local_b0,&local_a8,
                         &local_d8);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar3) {
        (local_e0->rep_).rep_hi_ = local_b0;
        (local_e0->rep_).rep_lo_ = (uint32_t)(local_a8.__r / 250000);
      }
      else if (err != (string *)0x0) {
        std::__cxx11::string::operator=((string *)err,(string *)&local_d8);
      }
      std::__cxx11::string::~string((string *)&local_d8);
      return bVar3;
    }
    sVar1 = *(size_t *)((long)&ParseTime::literals[0].size + lVar4);
    prefix._M_str = *(char **)((long)&ParseTime::literals[0].name + lVar4);
    prefix._M_len = sVar1;
    sv = (string_view *)pcVar2;
    bVar3 = StartsWith(text,prefix);
    if (bVar3) {
      local_d8._M_string_length = (long)(size_t *)local_98._M_str + sVar1;
      local_d8._M_dataplus._M_p = (pointer)(local_98._M_len - sVar1);
      ParseTime::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_d8,sv);
      if (local_d8._M_dataplus._M_p == (pointer)0x0) {
        (local_e0->rep_).rep_lo_ =
             *(uint32_t *)((long)&ParseTime::literals[0].value.rep_.rep_lo_ + lVar4);
        (local_e0->rep_).rep_hi_ =
             *(HiRep *)((long)&ParseTime::literals[0].value.rep_.rep_hi_.lo_ + lVar4);
        return true;
      }
    }
    lVar4 = lVar4 + 0x20;
  } while( true );
}

Assistant:

bool ParseTime(absl::string_view format, absl::string_view input,
               absl::TimeZone tz, absl::Time* time, std::string* err) {
  auto strip_leading_space = [](absl::string_view* sv) {
    while (!sv->empty()) {
      if (!std::isspace(sv->front())) return;
      sv->remove_prefix(1);
    }
  };

  // Portable toolchains means we don't get nice constexpr here.
  struct Literal {
    const char* name;
    size_t size;
    absl::Time value;
  };
  static Literal literals[] = {
      {kInfiniteFutureStr, strlen(kInfiniteFutureStr), InfiniteFuture()},
      {kInfinitePastStr, strlen(kInfinitePastStr), InfinitePast()},
  };
  strip_leading_space(&input);
  for (const auto& lit : literals) {
    if (absl::StartsWith(input, absl::string_view(lit.name, lit.size))) {
      absl::string_view tail = input;
      tail.remove_prefix(lit.size);
      strip_leading_space(&tail);
      if (tail.empty()) {
        *time = lit.value;
        return true;
      }
    }
  }

  std::string error;
  cctz_parts parts;
  const bool b =
      cctz::detail::parse(std::string(format), std::string(input),
                          cctz::time_zone(tz), &parts.sec, &parts.fem, &error);
  if (b) {
    *time = Join(parts);
  } else if (err != nullptr) {
    *err = std::move(error);
  }
  return b;
}